

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bmcFx.c
# Opt level: O1

int Bmc_FxComputeOne(Gia_Man_t *p,int nIterMax,int nDiv2Add)

{
  int nVars;
  void *__ptr;
  int iVar1;
  Cnf_Dat_t *p_00;
  sat_solver *s;
  Vec_Wec_t *vCubes;
  Vec_Int_t *pVVar2;
  int *piVar3;
  Vec_Int_t *vDivs;
  int iCiVarBeg;
  long lVar4;
  int iVarStart;
  char *__s;
  int iVar5;
  uint uVar6;
  int iVar7;
  ulong uVar8;
  long lVar9;
  
  p_00 = (Cnf_Dat_t *)Mf_ManGenerateCnf(p,8,0,0,0,0);
  s = (sat_solver *)Cnf_DataWriteIntoSolver(p_00,1,0);
  nVars = p->vCis->nSize;
  iVarStart = p_00->nVars;
  iVar1 = sat_solver_nvars(s);
  sat_solver_setnvars(s,nIterMax + iVar1 + 0x3e9);
  if (0 < nIterMax) {
    iCiVarBeg = iVarStart - nVars;
    uVar8 = 0;
    do {
      vCubes = (Vec_Wec_t *)malloc(0x10);
      vCubes->nCap = 1000;
      vCubes->nSize = 0;
      pVVar2 = (Vec_Int_t *)calloc(1000,0x10);
      vCubes->pArray = pVVar2;
      pVVar2 = (Vec_Int_t *)malloc(0x10);
      iVar5 = iVarStart - iCiVarBeg;
      if ((iVarStart - iCiVarBeg) - 1U < 0xf) {
        iVar5 = 0x10;
      }
      pVVar2->nSize = 0;
      pVVar2->nCap = iVar5;
      if (iVar5 == 0) {
        piVar3 = (int *)0x0;
      }
      else {
        piVar3 = (int *)malloc((long)iVar5 << 2);
      }
      pVVar2->pArray = piVar3;
      iVar5 = iCiVarBeg;
      if (iCiVarBeg < iVarStart) {
        do {
          Vec_IntPush(pVVar2,iVar5);
          iVar5 = iVar5 + 1;
        } while (iVarStart != iVar5);
      }
      uVar6 = iVar1 + 1000 + (int)uVar8;
      printf("\nIteration %d (Aux = %d)\n",uVar8,(ulong)uVar6);
      iVar5 = Bmc_FxSolve(s,0,uVar6,pVVar2,1,1,(int *)0x0,vCubes);
      __s = "Mismatch";
      if (iVar5 == 0) {
LAB_00594c89:
        puts(__s);
      }
      else if (iVar5 == -1) {
        __s = "Timeout";
        goto LAB_00594c89;
      }
      vDivs = Div_CubePairs(vCubes,nVars,nDiv2Add);
      if (0 < vCubes->nCap) {
        lVar4 = 8;
        lVar9 = 0;
        do {
          __ptr = *(void **)((long)&vCubes->pArray->nCap + lVar4);
          if (__ptr != (void *)0x0) {
            free(__ptr);
            *(undefined8 *)((long)&vCubes->pArray->nCap + lVar4) = 0;
          }
          lVar9 = lVar9 + 1;
          lVar4 = lVar4 + 0x10;
        } while (lVar9 < vCubes->nCap);
      }
      if (vCubes->pArray != (Vec_Int_t *)0x0) {
        free(vCubes->pArray);
        vCubes->pArray = (Vec_Int_t *)0x0;
      }
      vCubes->nCap = 0;
      vCubes->nSize = 0;
      free(vCubes);
      Bmc_FxAddClauses(s,vDivs,iCiVarBeg,iVarStart);
      iVar5 = vDivs->nSize;
      if (vDivs->pArray != (int *)0x0) {
        free(vDivs->pArray);
        vDivs->pArray = (int *)0x0;
      }
      if (vDivs != (Vec_Int_t *)0x0) {
        free(vDivs);
      }
      if (nVars + 1000 < pVVar2->nSize) {
        __assert_fail("Vec_IntSize(vVar2Sat) <= nCiVars + Extra",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/sat/bmc/bmcFx.c"
                      ,0x2c5,"int Bmc_FxComputeOne(Gia_Man_t *, int, int)");
      }
      iVar7 = iVar5 + 3;
      if (-1 < iVar5) {
        iVar7 = iVar5;
      }
      if (pVVar2->pArray != (int *)0x0) {
        free(pVVar2->pArray);
        pVVar2->pArray = (int *)0x0;
      }
      iVarStart = iVarStart + (iVar7 >> 2);
      free(pVVar2);
      uVar6 = (int)uVar8 + 1;
      uVar8 = (ulong)uVar6;
    } while (uVar6 != nIterMax);
  }
  sat_solver_delete(s);
  Cnf_DataFree(p_00);
  return 1;
}

Assistant:

int Bmc_FxComputeOne( Gia_Man_t * p, int nIterMax, int nDiv2Add )
{
    int Extra    = 1000;
    // create SAT solver
    Cnf_Dat_t * pCnf = (Cnf_Dat_t *)Mf_ManGenerateCnf( p, 8, 0, 0, 0, 0 );
    sat_solver * pSat = (sat_solver *)Cnf_DataWriteIntoSolver( pCnf, 1, 0 );
    // compute parameters
    int nCiVars   = Gia_ManCiNum(p);             // PI count
    int iCiVarBeg = pCnf->nVars - nCiVars;//- 1;   // first PI var
    int iCiVarCur = iCiVarBeg + nCiVars;         // current unused PI var
    int n, Iter, RetValue;
    // create variables
    int iAuxVarStart = sat_solver_nvars(pSat) + Extra; // the aux var
    sat_solver_setnvars( pSat, iAuxVarStart + 1 + nIterMax );
    for ( Iter = 0; Iter < nIterMax; Iter++ )
    {
        Vec_Wec_t * vCubes = Vec_WecAlloc( 1000 );
        // collect variables
        Vec_Int_t * vVar2Sat = Vec_IntAlloc( iCiVarCur-iCiVarBeg ), * vDivs;
//        for ( n = iCiVarCur - 1; n >= iCiVarBeg; n-- )
        for ( n = iCiVarBeg; n < iCiVarCur; n++ )
            Vec_IntPush( vVar2Sat, n );
        // iterate through outputs
        printf( "\nIteration %d (Aux = %d)\n", Iter, iAuxVarStart + Iter );
        RetValue = Bmc_FxSolve( pSat, 0, iAuxVarStart + Iter, vVar2Sat, 1, 1, NULL, vCubes );
        if ( RetValue == 0 )
            printf( "Mismatch\n" );
        if ( RetValue == -1 )
            printf( "Timeout\n" );
        // print cubes
        //Div_CubePrint( vCubes, nCiVars );
        vDivs = Div_CubePairs( vCubes, nCiVars, nDiv2Add );
        Vec_WecFree( vCubes );
        // add clauses and update variables
        Bmc_FxAddClauses( pSat, vDivs, iCiVarBeg, iCiVarCur );
        iCiVarCur += Vec_IntSize(vDivs)/4;
        Vec_IntFree( vDivs );
        // cleanup
        assert( Vec_IntSize(vVar2Sat) <= nCiVars + Extra );
        Vec_IntFree( vVar2Sat );
    }
    // cleanup
    sat_solver_delete( pSat );
    Cnf_DataFree( pCnf );
    return 1;
}